

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  pointer pCVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  DNA *__x;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  Class *class_;
  pointer pCVar8;
  ulong uVar9;
  undefined1 *puVar10;
  _Rb_tree_node_base *p_Var11;
  _Base_ptr *this;
  long lVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<Teacher> __l_00;
  initializer_list<Room> __l_01;
  initializer_list<Subject> __l_02;
  initializer_list<Group> __l_03;
  Day *mainDay;
  vector<Teacher,_std::allocator<Teacher>_> teachers;
  Population population;
  vector<Subject,_std::allocator<Subject>_> subjects;
  vector<Room,_std::allocator<Room>_> rooms;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  days;
  map<Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  schedule;
  DataStorage data;
  vector<Group,_std::allocator<Group>_> groups;
  key_type *local_708;
  vector<Teacher,_std::allocator<Teacher>_> local_700;
  char *local_6e8;
  size_type local_6e0;
  char local_6d8;
  undefined7 uStack_6d7;
  pointer pTStack_6d0;
  undefined1 *local_6c8;
  undefined8 local_6c0;
  undefined1 local_6b8;
  undefined7 uStack_6b7;
  undefined8 uStack_6b0;
  undefined1 *local_6a8;
  undefined8 local_6a0;
  undefined1 local_698;
  undefined7 uStack_697;
  undefined8 uStack_690;
  _Rb_tree_node_base *local_688;
  undefined8 local_680;
  undefined1 local_678 [16];
  _Base_ptr local_668;
  _Base_ptr local_660;
  undefined1 local_658 [16];
  pointer local_648;
  _Base_ptr local_640;
  undefined1 local_638 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  undefined1 local_618;
  uint7 uStack_617;
  _Base_ptr p_Stack_610;
  pointer local_608;
  pointer local_600;
  undefined1 local_5f8 [16];
  uint *local_5e8;
  size_type local_5e0;
  uint local_5d8;
  undefined4 uStack_5d4;
  _Base_ptr *local_5c8;
  undefined8 local_5c0;
  uint local_5b8;
  undefined4 uStack_5b4;
  _Base_ptr local_5a8;
  _Base_ptr local_5a0;
  undefined1 local_598 [16];
  pointer local_588;
  pointer local_580;
  undefined1 local_578 [16];
  uint *local_568;
  pointer local_560;
  uint local_558;
  undefined4 uStack_554;
  undefined1 *local_548;
  undefined8 local_540;
  undefined1 local_538;
  undefined7 uStack_537;
  _Base_ptr p_Stack_530;
  _Base_ptr local_528;
  size_t local_520;
  undefined1 local_518 [16];
  _Rb_tree_node_base *local_508;
  undefined8 local_500;
  undefined1 local_4f8 [16];
  _Rb_tree_node_base *local_4e8;
  _Base_ptr local_4e0;
  undefined1 local_4d8 [16];
  _Rb_tree_node_base *local_4c8;
  _Base_ptr local_4c0;
  undefined1 local_4b8 [16];
  pointer local_4a8;
  pointer local_4a0;
  undefined1 local_498 [16];
  _Base_ptr *local_488;
  undefined8 local_480;
  uint local_478;
  undefined4 uStack_474;
  vector<Subject,_std::allocator<Subject>_> local_468;
  vector<Subject,_std::allocator<Subject>_> local_448;
  vector<Subject,_std::allocator<Subject>_> local_428;
  vector<Teacher,_std::allocator<Teacher>_> local_408;
  vector<Teacher,_std::allocator<Teacher>_> local_3e8;
  vector<Teacher,_std::allocator<Teacher>_> local_3c8;
  vector<Teacher,_std::allocator<Teacher>_> local_3a8;
  vector<Teacher,_std::allocator<Teacher>_> local_388;
  vector<Teacher,_std::allocator<Teacher>_> local_368;
  vector<Teacher,_std::allocator<Teacher>_> local_348;
  vector<Teacher,_std::allocator<Teacher>_> local_328;
  vector<Teacher,_std::allocator<Teacher>_> local_308;
  undefined1 local_2f0 [20];
  undefined4 uStack_2dc;
  undefined1 auStack_2d8 [8];
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  pointer local_2c8;
  undefined1 auStack_2c0 [8];
  pointer pSStack_2b8;
  _Base_ptr local_2b0;
  undefined1 local_2a8 [16];
  size_t sStack_298;
  _Rb_tree_node_base local_290;
  undefined1 local_270 [16];
  pointer local_260 [3];
  _Base_ptr local_248;
  _Base_ptr p_Stack_240;
  pointer pSStack_238;
  pointer local_230;
  pointer pSStack_228;
  undefined1 local_220 [16];
  _Rb_tree_node_base *local_210 [2];
  _Rb_tree_node_base local_200;
  pointer pTStack_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  pointer local_1b8;
  pointer local_1b0;
  pointer pTStack_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  pointer local_180;
  pointer local_178;
  pointer pTStack_170;
  _Rb_tree_node_base *local_168;
  _Base_ptr local_160;
  _Rb_tree_node_base local_158;
  pointer pTStack_138;
  _Rb_tree_node_base *local_130;
  undefined8 local_128;
  _Rb_tree_node_base local_120;
  pointer pTStack_100;
  key_type *local_f8;
  vector<Subject,_std::allocator<Subject>_> local_f0;
  vector<Room,_std::allocator<Room>_> local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  local_a8;
  DataStorage local_78;
  vector<Group,_std::allocator<Group>_> local_48;
  
  local_2f0._0_8_ = local_2f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"Monday","");
  _local_2d0 = (pointer)auStack_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Tuesday","");
  local_2b0 = (_Base_ptr)(local_2a8 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Wednesday","");
  local_290._0_8_ = &local_290._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Thursday","");
  puVar10 = (undefined1 *)local_260;
  local_270._0_8_ = puVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"Friday","");
  __l._M_len = 5;
  __l._M_array = (iterator)local_2f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,__l,(allocator_type *)&local_78);
  lVar12 = -0xa0;
  do {
    if (puVar10 != *(undefined1 **)(puVar10 + 0xfffffffffffffff0)) {
      operator_delete(*(undefined1 **)(puVar10 + 0xfffffffffffffff0),*(long *)puVar10 + 1);
    }
    puVar10 = puVar10 + 0xffffffffffffffe0;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  local_568 = &local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"Merk","");
  local_2f0._0_8_ = local_2f0 + 0x10;
  if (local_568 != &local_558) {
    local_2f0._0_8_ = local_568;
  }
  uStack_2dc = uStack_554;
  local_2f0._16_4_ = local_558;
  local_2f0._8_8_ = local_560;
  local_560 = (pointer)0x0;
  local_558 = local_558 & 0xffffff00;
  local_588 = (pointer)local_578;
  local_568 = &local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"Margo","");
  _local_2d0 = (pointer)auStack_2c0;
  if (local_588 != (pointer)local_578) {
    _local_2d0 = local_588;
  }
  auStack_2c0._4_4_ = local_578._4_4_;
  auStack_2c0._0_4_ = local_578._0_4_;
  local_2c8 = local_580;
  local_580 = (pointer)0x0;
  local_578._0_4_ = local_578._0_4_ & 0xffffff00;
  local_5a8 = (_Base_ptr)local_598;
  local_588 = (pointer)local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"Fish","");
  local_2b0 = (_Base_ptr)(local_2a8 + 8);
  if (local_5a8 != (_Base_ptr)local_598) {
    local_2b0 = local_5a8;
  }
  local_2a8._12_4_ = local_598._4_4_;
  local_2a8._8_4_ = local_598._0_4_;
  local_2a8._0_8_ = local_5a0;
  local_5a0 = (_Base_ptr)0x0;
  local_598._0_4_ = local_598._0_4_ & 0xffffff00;
  local_5c8 = (_Base_ptr *)&local_5b8;
  local_5a8 = (_Base_ptr)local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"Roma","");
  local_290._0_8_ = &local_290._M_left;
  if (local_5c8 != (_Base_ptr *)&local_5b8) {
    local_290._0_8_ = local_5c8;
  }
  local_290._M_parent = (_Base_ptr)local_5c0;
  local_5c0 = 0;
  local_5b8 = local_5b8 & 0xffffff00;
  local_5e8 = &local_5d8;
  local_5c8 = (_Base_ptr *)&local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"Pokemon","");
  local_270._0_8_ = local_260;
  if (local_5e8 != &local_5d8) {
    local_270._0_8_ = local_5e8;
  }
  local_270._8_8_ = local_5e0;
  local_5e0 = 0;
  local_5d8 = local_5d8 & 0xffffff00;
  local_5e8 = &local_5d8;
  local_488 = (_Base_ptr *)&local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"Biba","");
  local_260[2] = (pointer)&p_Stack_240;
  if (local_488 != (_Base_ptr *)&local_478) {
    local_260[2] = (pointer)local_488;
  }
  local_248 = (_Base_ptr)local_480;
  local_480 = 0;
  local_478 = local_478 & 0xffffff00;
  local_4a8 = (pointer)local_498;
  local_488 = (_Base_ptr *)&local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"Nika","");
  local_230 = (pointer)local_220;
  if (local_4a8 != (pointer)local_498) {
    local_230 = local_4a8;
  }
  pSStack_228 = local_4a0;
  local_4a0 = (pointer)0x0;
  local_498._0_4_ = local_498._0_4_ & 0xffffff00;
  local_4c8 = (_Rb_tree_node_base *)local_4b8;
  local_4a8 = (pointer)local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"Vlad","");
  p_Var11 = &local_200;
  if (local_4c8 == (_Rb_tree_node_base *)local_4b8) {
    local_200._M_parent = (_Base_ptr)local_4b8._8_8_;
    local_210[0] = p_Var11;
  }
  else {
    local_210[0] = local_4c8;
  }
  local_210[1] = local_4c0;
  local_4c0 = (_Base_ptr)0x0;
  local_4b8[0] = _S_red;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)local_2f0;
  local_4c8 = (_Rb_tree_node_base *)local_4b8;
  std::vector<Teacher,_std::allocator<Teacher>_>::vector
            (&local_700,__l_00,(allocator_type *)&local_78);
  lVar12 = -0x100;
  do {
    if (p_Var11 != p_Var11[-1]._M_left) {
      operator_delete(p_Var11[-1]._M_left,*(long *)p_Var11 + 1);
    }
    p_Var11 = p_Var11 + -1;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0);
  if (local_4c8 != (_Rb_tree_node_base *)local_4b8) {
    operator_delete(local_4c8,CONCAT71(local_4b8._1_7_,local_4b8[0]) + 1);
  }
  if (local_4a8 != (pointer)local_498) {
    operator_delete(local_4a8,CONCAT44(local_498._4_4_,local_498._0_4_) + 1);
  }
  if (local_488 != (_Base_ptr *)&local_478) {
    operator_delete(local_488,CONCAT44(uStack_474,local_478) + 1);
  }
  if (local_5e8 != &local_5d8) {
    operator_delete(local_5e8,CONCAT44(uStack_5d4,local_5d8) + 1);
  }
  if (local_5c8 != (_Base_ptr *)&local_5b8) {
    operator_delete(local_5c8,CONCAT44(uStack_5b4,local_5b8) + 1);
  }
  if (local_5a8 != (_Base_ptr)local_598) {
    operator_delete(local_5a8,CONCAT44(local_598._4_4_,local_598._0_4_) + 1);
  }
  if (local_588 != (pointer)local_578) {
    operator_delete(local_588,CONCAT44(local_578._4_4_,local_578._0_4_) + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,CONCAT44(uStack_554,local_558) + 1);
  }
  local_2f0._0_4_ = 0xd7;
  local_2f0._8_8_ = (pointer)0x1e;
  local_2f0._16_4_ = 0x1f9;
  auStack_2d8 = (undefined1  [8])0x23;
  local_2d0 = 1;
  local_2c8 = (pointer)0x1b;
  auStack_2c0._0_4_ = 0x27;
  pSStack_2b8 = (pointer)0x64;
  local_2b0 = (_Base_ptr)CONCAT44(local_2b0._4_4_,0x12f);
  local_2a8._0_8_ = (_Base_ptr)0x19;
  local_2a8._8_4_ = 0x1b;
  sStack_298 = 0x23;
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)local_2f0;
  std::vector<Room,_std::allocator<Room>_>::vector(&local_d8,__l_01,(allocator_type *)&local_78);
  local_608 = (pointer)local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"Algebra","");
  GetRandomSubsetOfTeachers(&local_308,&local_700);
  if (local_608 == (pointer)local_5f8) {
    auStack_2d8 = (undefined1  [8])local_5f8._8_8_;
    local_2f0._0_8_ = local_2f0 + 0x10;
  }
  else {
    local_2f0._0_8_ = local_608;
  }
  local_2f0._8_8_ = local_600;
  local_600 = (pointer)0x0;
  local_5f8[0] = '\0';
  _local_2d0 = local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_2c8 = (pointer)local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  auStack_2c0 = (undefined1  [8])
                local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_308.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puVar10 = local_638 + 0x20;
  local_628._M_allocated_capacity = (size_type)puVar10;
  local_608 = (pointer)local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_638 + 0x10),"Geometry","");
  GetRandomSubsetOfTeachers(&local_328,&local_700);
  pSStack_2b8 = (pointer)local_2a8;
  if ((undefined1 *)local_628._M_allocated_capacity == puVar10) {
    local_2a8._8_8_ = p_Stack_610;
  }
  else {
    pSStack_2b8 = (pointer)local_628._M_allocated_capacity;
  }
  local_2a8._0_8_ = (ulong)uStack_617 << 8;
  local_2b0 = (_Base_ptr)local_628._8_8_;
  local_628._8_8_ = 0;
  local_618 = 0;
  sStack_298 = (size_t)local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                       super__Vector_impl_data._M_start;
  local_290._0_8_ =
       local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_290._M_parent =
       (_Base_ptr)
       local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_328.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_648 = (pointer)local_638;
  local_628._M_allocated_capacity = (size_type)puVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"Programming","");
  GetRandomSubsetOfTeachers(&local_348,&local_700);
  local_290._M_left = (_Base_ptr)local_270;
  if (local_648 == (pointer)local_638) {
    local_270._8_8_ = local_638._8_8_;
  }
  else {
    local_290._M_left = (_Base_ptr)local_648;
  }
  local_290._M_right = local_640;
  local_640 = (_Base_ptr)0x0;
  local_638[0] = 0;
  local_260[0] = local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_260[1] = local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  local_260[2] = local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_348.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_668 = (_Base_ptr)local_658;
  local_648 = (pointer)local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"Discrete Math","");
  GetRandomSubsetOfTeachers(&local_368,&local_700);
  p_Var6 = (_Base_ptr)&pSStack_238;
  if (local_668 == (_Base_ptr)local_658) {
    local_230 = (pointer)local_658._8_8_;
    local_248 = p_Var6;
  }
  else {
    local_248 = local_668;
  }
  p_Stack_240 = local_660;
  local_660 = (_Base_ptr)0x0;
  local_658[0] = _S_red;
  pSStack_228 = (pointer)local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                         super__Vector_impl_data._M_start;
  local_220._0_8_ =
       local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_220._8_8_ =
       local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_368.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_688 = (_Rb_tree_node_base *)local_678;
  local_668 = (_Base_ptr)local_658;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"DataStorage science","");
  GetRandomSubsetOfTeachers(&local_388,&local_700);
  local_210[0] = &local_200;
  if (local_688 == (_Rb_tree_node_base *)local_678) {
    local_200._M_parent = (_Base_ptr)local_678._8_8_;
  }
  else {
    local_210[0] = local_688;
  }
  local_210[1] = (_Rb_tree_node_base *)local_680;
  local_680 = 0;
  local_678[0] = _S_red;
  local_200._M_left =
       (_Base_ptr)
       local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_200._M_right =
       (_Base_ptr)
       local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pTStack_1e0 = local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_388.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_6a8 = &local_698;
  local_688 = (_Rb_tree_node_base *)local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"DataStorage structures","");
  GetRandomSubsetOfTeachers(&local_3a8,&local_700);
  local_1d8 = local_1c8;
  if (local_6a8 == &local_698) {
    uStack_1c0 = uStack_690;
  }
  else {
    local_1d8 = local_6a8;
  }
  local_1d0 = local_6a0;
  local_6a0 = 0;
  local_698 = 0;
  local_1b8 = local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_1b0 = local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pTStack_1a8 = local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3a8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_6c8 = &local_6b8;
  local_6a8 = &local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"Math Anal.","");
  GetRandomSubsetOfTeachers(&local_3c8,&local_700);
  local_1a0 = local_190;
  if (local_6c8 == &local_6b8) {
    uStack_188 = uStack_6b0;
  }
  else {
    local_1a0 = local_6c8;
  }
  local_198 = local_6c0;
  local_6c0 = 0;
  local_6b8 = 0;
  local_180 = local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_178 = local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pTStack_170 = local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_6c8 = &local_6b8;
  local_4e8 = (_Rb_tree_node_base *)local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"Prob. Th.","");
  GetRandomSubsetOfTeachers(&local_3e8,&local_700);
  local_168 = &local_158;
  if (local_4e8 == (_Rb_tree_node_base *)local_4d8) {
    local_158._M_parent = (_Base_ptr)local_4d8._8_8_;
  }
  else {
    local_168 = local_4e8;
  }
  local_160 = local_4e0;
  local_4e0 = (_Base_ptr)0x0;
  local_4d8[0] = _S_red;
  local_158._M_left =
       (_Base_ptr)
       local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_158._M_right =
       (_Base_ptr)
       local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pTStack_138 = local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3e8.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_508 = (_Rb_tree_node_base *)local_4f8;
  local_4e8 = (_Rb_tree_node_base *)local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"Algorithms","");
  GetRandomSubsetOfTeachers(&local_408,&local_700);
  local_130 = &local_120;
  if (local_508 == (_Rb_tree_node_base *)local_4f8) {
    local_120._M_parent = (_Base_ptr)local_4f8._8_8_;
  }
  else {
    local_130 = local_508;
  }
  local_128 = local_500;
  local_500 = 0;
  local_4f8[0] = _S_red;
  local_120._M_left =
       (_Base_ptr)
       local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_120._M_right =
       (_Base_ptr)
       local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pTStack_100 = local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_408.super__Vector_base<Teacher,_std::allocator<Teacher>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __l_02._M_len = 9;
  __l_02._M_array = (iterator)local_2f0;
  local_508 = (_Rb_tree_node_base *)local_4f8;
  std::vector<Subject,_std::allocator<Subject>_>::vector
            (&local_f0,__l_02,(allocator_type *)&local_78);
  lVar12 = -0x1f8;
  this = &local_120._M_left;
  do {
    std::vector<Teacher,_std::allocator<Teacher>_>::~vector
              ((vector<Teacher,_std::allocator<Teacher>_> *)this);
    if ((_Rb_tree_node_base *)(this + -2) != this[-4]) {
      operator_delete(this[-4],*(long *)(this + -2) + 1);
    }
    this = this + -7;
    lVar12 = lVar12 + 0x38;
  } while (lVar12 != 0);
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_408);
  if (local_508 != (_Rb_tree_node_base *)local_4f8) {
    operator_delete(local_508,CONCAT71(local_4f8._1_7_,local_4f8[0]) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_3e8);
  if (local_4e8 != (_Rb_tree_node_base *)local_4d8) {
    operator_delete(local_4e8,CONCAT71(local_4d8._1_7_,local_4d8[0]) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_3c8);
  if (local_6c8 != &local_6b8) {
    operator_delete(local_6c8,CONCAT71(uStack_6b7,local_6b8) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_3a8);
  if (local_6a8 != &local_698) {
    operator_delete(local_6a8,CONCAT71(uStack_697,local_698) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_388);
  if (local_688 != (_Rb_tree_node_base *)local_678) {
    operator_delete(local_688,CONCAT71(local_678._1_7_,local_678[0]) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_368);
  if (local_668 != (_Base_ptr)local_658) {
    operator_delete(local_668,CONCAT71(local_658._1_7_,local_658[0]) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_348);
  if (local_648 != (pointer)local_638) {
    operator_delete(local_648,CONCAT71(local_638._1_7_,local_638[0]) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_328);
  if ((undefined1 *)local_628._M_allocated_capacity != local_638 + 0x20) {
    operator_delete((void *)local_628._M_allocated_capacity,CONCAT71(uStack_617,local_618) + 1);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_308);
  if (local_608 != (pointer)local_5f8) {
    operator_delete(local_608,CONCAT71(local_5f8._1_7_,local_5f8[0]) + 1);
  }
  local_6e8 = &local_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"TTP-42","");
  GetRandomSubsetOfSubjects(&local_428,&local_f0);
  local_2f0._8_8_ = auStack_2d8;
  local_2f0._0_4_ = Group::counter;
  if (local_6e8 == &local_6d8) {
    _local_2d0 = pTStack_6d0;
  }
  else {
    local_2f0._8_8_ = local_6e8;
  }
  stack0xfffffffffffffd20 = local_6e0;
  local_6e0 = 0;
  local_6d8 = '\0';
  local_2c8 = local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
              super__Vector_impl_data._M_start;
  auStack_2c0 = (undefined1  [8])
                local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
                super__Vector_impl_data._M_finish;
  pSStack_2b8 = local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_428.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2b0 = (_Base_ptr)0x14;
  Group::counter = Group::counter + 1;
  local_6e8 = &local_6d8;
  local_528 = (_Base_ptr)local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"TTP-41","");
  GetRandomSubsetOfSubjects(&local_448,&local_f0);
  local_2a8._8_8_ = &local_290;
  local_2a8._0_4_ = Group::counter;
  if (local_528 == (_Base_ptr)local_518) {
    local_290._M_parent = (_Base_ptr)local_518._8_8_;
  }
  else {
    local_2a8._8_8_ = local_528;
  }
  sStack_298 = local_520;
  local_520 = 0;
  local_518[0] = 0;
  local_290._M_left =
       (_Base_ptr)
       local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_290._M_right =
       (_Base_ptr)
       local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_270._0_8_ =
       local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_448.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_270._8_8_ = 0x1e;
  Group::counter = Group::counter + 1;
  local_548 = &local_538;
  local_528 = (_Base_ptr)local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"MI-4","");
  GetRandomSubsetOfSubjects(&local_468,&local_f0);
  local_260[1] = (pointer)((long)local_260 + 0x18);
  local_260[0] = (pointer)CONCAT44(local_260[0]._4_4_,Group::counter);
  if (local_548 == &local_538) {
    p_Stack_240 = p_Stack_530;
  }
  else {
    local_260[1] = (pointer)local_548;
  }
  local_260[2] = (pointer)local_540;
  local_540 = 0;
  local_538 = 0;
  pSStack_238 = local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_230 = local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pSStack_228 = local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_468.super__Vector_base<Subject,_std::allocator<Subject>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_220._0_8_ = 0x1a;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)local_2f0;
  Group::counter = Group::counter + 1;
  local_548 = &local_538;
  std::vector<Group,_std::allocator<Group>_>::vector(&local_48,__l_03,(allocator_type *)&local_78);
  lVar12 = -0xd8;
  do {
    std::vector<Subject,_std::allocator<Subject>_>::~vector
              ((vector<Subject,_std::allocator<Subject>_> *)p_Var6);
    if ((pointer)((long)(p_Var6 + 0xffffffffffffffff) + 0x10U) !=
        *(pointer *)
         &((_Vector_base<Subject,_std::allocator<Subject>_> *)(p_Var6 + 0xffffffffffffffff))->
          _M_impl) {
      operator_delete(*(pointer *)
                       &((_Vector_base<Subject,_std::allocator<Subject>_> *)
                        (p_Var6 + 0xffffffffffffffff))->_M_impl,
                      (ulong)((long)&(*(pointer *)
                                       &((_Vector_base<Subject,_std::allocator<Subject>_> *)
                                        ((long)(p_Var6 + 0xffffffffffffffff) + 0x10U))->_M_impl)->
                                     name + 1));
    }
    p_Var6 = (_Base_ptr)((long)(p_Var6 + 0xfffffffffffffffd) + 0x18);
    lVar12 = lVar12 + 0x48;
  } while (lVar12 != 0);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_468);
  if (local_548 != &local_538) {
    operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
  }
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_448);
  if (local_528 != (_Base_ptr)local_518) {
    operator_delete(local_528,CONCAT71(local_518._1_7_,local_518[0]) + 1);
  }
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_428);
  local_78.rooms = &local_d8;
  local_78.teachers = &local_700;
  if (local_6e8 != &local_6d8) {
    operator_delete(local_6e8,CONCAT71(uStack_6d7,local_6d8) + 1);
  }
  local_78.days = &local_c0;
  local_78.LESSONS_PER_DAY = 4;
  local_78.groups = &local_48;
  local_78.subjects = &local_f0;
  Population::Population((Population *)local_2f0,&local_78,0.02,0x32);
  uVar9 = 1;
  uVar7 = 0;
  while (bVar2 = Population::AnswerReady((Population *)local_2f0), !bVar2 && uVar7 < 5000000) {
    Population::evolve((Population *)local_2f0);
    if ((int)(uVar9 / 100) * 100 - 1U == uVar7) {
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar7 + 1);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
    uVar9 = (ulong)((int)uVar9 + 1);
    uVar7 = uVar7 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"population size = ",0x12);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mutation rate = ",0x10);
  poVar4 = std::ostream::_M_insert<double>(0.02);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iterations = ",0xd);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"answer is ready = ",0x12);
  Population::AnswerReady((Population *)local_2f0);
  poVar4 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n\n",3);
  __x = Population::GetAnswer((Population *)local_2f0);
  std::
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  ::_Rb_tree(&local_a8,
             (_Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
              *)__x);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=================================\n",0x22);
  local_708 = local_c0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_f8 = local_c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Day: ",6);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(local_708->_M_dataplus)._M_p,
                          local_708->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
      for (p_Var6 = local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &local_a8._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>
                               *)&p_Var6[3]._M_parent,local_708);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Group: ",9);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)p_Var6[1]._M_parent,
                            (long)p_Var6[1]._M_left);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        pCVar1 = (pmVar5->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pCVar8 = (pmVar5->super__Vector_base<Class,_std::allocator<Class>_>)._M_impl.
                      super__Vector_impl_data._M_start; pCVar8 != pCVar1; pCVar8 = pCVar8 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  room = ",9);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(pCVar8->room).number);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  lesson = ",0xb);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(pCVar8->subject).name._M_dataplus._M_p,
                              (pCVar8->subject).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  teacher = ",0xc);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(pCVar8->teacher).name._M_dataplus._M_p,
                              (pCVar8->teacher).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  --------------------\n",0x17);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"=================================\n",0x22);
      local_708 = local_708 + 1;
    } while (local_708 != local_f8);
  }
  std::
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  ::~_Rb_tree(&local_a8);
  std::
  _Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<Group,_std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>,_std::_Select1st<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>,_std::less<Group>,_std::allocator<std::pair<const_Group,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Class,_std::allocator<Class>_>_>_>_>_>_>_>
               *)auStack_2c0);
  std::vector<DNA,_std::allocator<DNA>_>::~vector
            ((vector<DNA,_std::allocator<DNA>_> *)(local_2f0 + 8));
  std::vector<Group,_std::allocator<Group>_>::~vector(&local_48);
  std::vector<Subject,_std::allocator<Subject>_>::~vector(&local_f0);
  if (local_d8.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<Teacher,_std::allocator<Teacher>_>::~vector(&local_700);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  return 0;
}

Assistant:

int main() {
    vector<Day> days = {"Monday", "Tuesday", "Wednesday", "Thursday", "Friday"}; // 5
    vector<Teacher> teachers = {
            Teacher("Merk"),
            Teacher("Margo"),
            Teacher("Fish"),
            Teacher("Roma"),
            Teacher("Pokemon"),
            Teacher("Biba"),
            Teacher("Nika"),
            Teacher("Vlad"),
    }; // 8
    vector<Room> rooms = {
            Room(215, 30),
            Room(505, 35),
            Room(1, 27),
            Room(39, 100),
            Room(303, 25),
            Room(27, 35),
    }; // 6
    vector<Subject> subjects = {
            Subject("Algebra", GetRandomSubsetOfTeachers(teachers)),
            Subject("Geometry", GetRandomSubsetOfTeachers(teachers)),
            Subject("Programming", GetRandomSubsetOfTeachers(teachers)),
            Subject("Discrete Math", GetRandomSubsetOfTeachers(teachers)),
            Subject("DataStorage science", GetRandomSubsetOfTeachers(teachers)),
            Subject("DataStorage structures", GetRandomSubsetOfTeachers(teachers)),
            Subject("Math Anal.", GetRandomSubsetOfTeachers(teachers)),
            Subject("Prob. Th.", GetRandomSubsetOfTeachers(teachers)),
            Subject("Algorithms", GetRandomSubsetOfTeachers(teachers)),
    }; // 9
    vector<Group> groups = {
            Group("TTP-42", GetRandomSubsetOfSubjects(subjects), 20),
            Group("TTP-41", GetRandomSubsetOfSubjects(subjects), 30),
            Group("MI-4", GetRandomSubsetOfSubjects(subjects), 26),
    };

    DataStorage data(groups, subjects, rooms, teachers, days, LESSONS_PER_DAY);

    Population population(data, MUTATION_RATE, POPULATION_SIZE);

    int iterations = 0;

    while (!population.AnswerReady() && iterations < EVOLUTION_MAX_ITERATIONS) {
        ++iterations;
        population.evolve();
        if (iterations % 100 == 0) {
            cout << iterations << endl;
        }
    }

    cout << "population size = " << POPULATION_SIZE << "\n";
    cout << "mutation rate = " << MUTATION_RATE << "\n";
    cout << "iterations = " << iterations << "\n";
    cout << "answer is ready = " << population.AnswerReady() << "\n\n\n";

    auto schedule = population.GetAnswer().schedule.schedule;

    cout << "=================================\n";

    for (const Day& mainDay : days) {
        cout << "[Day: " << mainDay << "]\n";

        for (auto&[group, schedulePerGroup] : schedule) {
            auto& listOfClasses = schedulePerGroup[mainDay];
            cout << "  Group: " << group.name << "\n";
            for (Class& class_ : listOfClasses) {
                cout << "  " << class_.time.number + 1 << ")\n";
                cout << "  room = " << class_.room.number << "\n";
                cout << "  lesson = " << class_.subject.name << "\n";
                cout << "  teacher = " << class_.teacher.name << "\n";
            }
            cout << "  --------------------\n";
        }
        cout << "=================================\n";
    }

    return 0;
}